

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::SetWasCalledFromLoop(FunctionBody *this)

{
  code *pcVar1;
  anon_class_12_3_8c788a2b fn;
  bool bVar2;
  uint16 uVar3;
  uint uVar4;
  LocalFunctionId functionId;
  uint32 loopInterpreterLimit;
  uint uVar5;
  undefined4 *puVar6;
  uint newLoopProfileThreshold;
  uint oldLoopProfileThreshold;
  uint newLoopInterpreterLimit;
  uint oldLoopInterpreterLimit;
  uint16 fullJitThreshold;
  FunctionBody *this_local;
  
  if ((*(uint *)&this->field_0x178 >> 0xf & 1) == 0) {
    *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffff7fff | 0x8000;
    if ((DAT_01eafd98 & 1) == 0) {
      FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
      TraceExecutionMode(this,"WasCalledFromLoop (before)");
      uVar3 = FunctionExecutionStateMachine::GetFullJitThreshold(&this->executionState);
      if (1 < uVar3) {
        FunctionExecutionStateMachine::SetFullJitThreshold
                  (&this->executionState,uVar3 / 2,(bool)((DAT_01eafdac ^ 0xff) & 1));
      }
    }
    else {
      uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ExecutionModePhase,uVar4,functionId);
      if (bVar2) {
        FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
        TraceExecutionMode(this,"WasCalledFromLoop (before)");
      }
    }
    loopInterpreterLimit = GetLoopInterpreterLimit(this);
    uVar4 = GetReducedLoopInterpretCount();
    if (loopInterpreterLimit < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1c4e,"(newLoopInterpreterLimit <= oldLoopInterpreterLimit)",
                                  "newLoopInterpreterLimit <= oldLoopInterpreterLimit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    SetLoopInterpreterLimit(this,uVar4);
    uVar5 = GetLoopProfileThreshold(this,loopInterpreterLimit);
    uVar4 = GetLoopProfileThreshold(this,uVar4);
    fn.oldLoopInterpreterLimit = loopInterpreterLimit;
    fn.newLoopProfileThreshold = uVar4;
    fn.oldLoopProfileThreshold = uVar5;
    MapLoopHeaders<Js::FunctionBody::SetWasCalledFromLoop()::__0>(this,fn);
    TraceExecutionMode(this,"WasCalledFromLoop");
  }
  return;
}

Assistant:

void FunctionBody::SetWasCalledFromLoop()
    {
        if(wasCalledFromLoop)
        {
            return;
        }
        wasCalledFromLoop = true;

        if(Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            if(PHASE_TRACE(Phase::ExecutionModePhase, this))
            {
                executionState.CommitExecutedIterations();
                TraceExecutionMode("WasCalledFromLoop (before)");
            }
        }
        else
        {
            // This function is likely going to be called frequently since it's called from a loop. Reduce the full JIT
            // threshold to realize the full JIT perf benefit sooner.
            executionState.CommitExecutedIterations();
            TraceExecutionMode("WasCalledFromLoop (before)");
            uint16 fullJitThreshold = executionState.GetFullJitThreshold();
            if(fullJitThreshold > 1)
            {
                executionState.SetFullJitThreshold(fullJitThreshold / 2, !CONFIG_FLAG(NewSimpleJit));
            }
        }

        {
            // Reduce the loop interpreter limit too, for the same reasons as above
            const uint oldLoopInterpreterLimit = GetLoopInterpreterLimit();
            const uint newLoopInterpreterLimit = GetReducedLoopInterpretCount();
            Assert(newLoopInterpreterLimit <= oldLoopInterpreterLimit);
            SetLoopInterpreterLimit(newLoopInterpreterLimit);

            // Adjust loop headers' interpret counts to ensure that loops will still be profiled a number of times before
            // loop bodies are jitted
            const uint oldLoopProfileThreshold = GetLoopProfileThreshold(oldLoopInterpreterLimit);
            const uint newLoopProfileThreshold = GetLoopProfileThreshold(newLoopInterpreterLimit);
            MapLoopHeaders([=](const uint index, LoopHeader *const loopHeader)
            {
                const uint interpretedCount = loopHeader->interpretCount;
                if(interpretedCount <= newLoopProfileThreshold || interpretedCount >= oldLoopInterpreterLimit)
                {
                    // The loop hasn't been profiled yet and wouldn't have started profiling even with the new profile
                    // threshold, or it has already been profiled the necessary minimum number of times based on the old limit
                    return;
                }

                if(interpretedCount <= oldLoopProfileThreshold)
                {
                    // The loop hasn't been profiled yet, but would have started profiling with the new profile threshold. Start
                    // profiling on the next iteration.
                    loopHeader->interpretCount = newLoopProfileThreshold;
                    return;
                }

                // The loop has been profiled some already. Preserve the number of profiled iterations.
                loopHeader->interpretCount = newLoopProfileThreshold + (interpretedCount - oldLoopProfileThreshold);
            });
        }

        TraceExecutionMode("WasCalledFromLoop");
    }